

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::clearDualBounds
          (SPxSolverBase<double> *this,Status stat,double *upp,double *lw)

{
  double dVar1;
  uint uVar2;
  long in_FS_OFFSET;
  undefined4 local_28;
  undefined4 uStack_24;
  
  uVar2 = stat + D_ON_BOTH;
  if (uVar2 < 0xb) {
    if ((0x81U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar2 & 0x1f) & 1) == 0) {
          return;
        }
        ::soplex::infinity::__tls_init();
        *upp = *(double *)(in_FS_OFFSET + -8);
        return;
      }
      ::soplex::infinity::__tls_init();
      local_28 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uStack_24 = (undefined4)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    }
    else {
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *upp = dVar1;
      ::soplex::infinity::__tls_init();
      local_28 = SUB84(dVar1,0);
      uStack_24 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    *lw = -(double)CONCAT44(uStack_24,local_28);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}